

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O2

char * choc::text::FloatToStringBuffer<double>::writeWithoutExponentLessThan1
                 (char *dest,uint32_t length,int mantissaDigits,int maxDecimalPlaces)

{
  uint32_t i;
  ulong uVar1;
  char *pcVar2;
  undefined4 in_register_0000000c;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  pcVar3 = (char *)CONCAT44(in_register_0000000c,maxDecimalPlaces);
  uVar5 = 2 - mantissaDigits;
  memmove(dest + uVar5,dest,(ulong)length);
  for (uVar1 = 0; uVar5 != uVar1; uVar1 = uVar1 + 1) {
    dest[uVar1] = '0';
  }
  dest[1] = '.';
  if (mantissaDigits + maxDecimalPlaces < (int)length) {
    uVar5 = maxDecimalPlaces + 1;
    do {
      uVar4 = uVar5;
      pcVar2 = (char *)(ulong)uVar4;
      if ((int)uVar4 < 3) goto LAB_002209d5;
      pcVar3 = pcVar2;
      uVar5 = uVar4 - 1;
    } while (dest[(long)pcVar2] == '0');
    pcVar3 = pcVar2 + (long)dest + 1;
LAB_002209d5:
    pcVar2 = dest + 3;
    if (2 < (int)uVar4) {
      pcVar2 = pcVar3;
    }
  }
  else {
    uVar1 = (ulong)(uVar5 + length);
    do {
      uVar6 = uVar1 - 1;
      if (uVar1 < 4) break;
      uVar1 = uVar6;
    } while (dest[uVar6 & 0xffffffff] == '0');
    pcVar2 = dest + ((int)uVar6 + 1);
  }
  return pcVar2;
}

Assistant:

static char* writeWithoutExponentLessThan1 (char* dest, uint32_t length, int mantissaDigits, int maxDecimalPlaces)
    {
        auto numPaddingZeros = static_cast<uint32_t> (2 - mantissaDigits);
        insertChar (dest, length, '0', numPaddingZeros);
        dest[1] = '.';

        if (static_cast<int> (length) > maxDecimalPlaces + mantissaDigits)
        {
            for (int i = maxDecimalPlaces + 1; i > 2; --i)
                if (dest[i] != '0')
                    return dest + (i + 1);

            return dest + 3;
        }

        length += numPaddingZeros;

        while (dest[length - 1] == '0' && length > 3)
            --length;

        return dest + length;
    }